

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O1

char * TEST_bool_combined(void)

{
  int iVar1;
  char *pcVar2;
  uint c;
  uint b;
  cargo_t cargo;
  uint a;
  char *args [3];
  uint local_40;
  uint local_3c;
  cargo_t local_38;
  uint local_2c;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  char *local_18;
  
  iVar1 = cargo_init(&local_38,0,"program");
  if (iVar1 == 0) {
    local_2c = 0;
    local_3c = 0;
    local_40 = 0;
    local_18 = "123";
    local_28 = 0x12ab1a;
    uStack_24 = 0;
    uStack_20 = 0x12a474;
    uStack_1c = 0;
    iVar1 = cargo_add_option(local_38,0,"--alpha -a",(char *)0x0,"b");
    pcVar2 = "Failed to add option";
    if (((iVar1 == 0) &&
        (iVar1 = cargo_add_option(local_38,0,"--beta -b",(char *)0x0,"b",&local_3c), iVar1 == 0)) &&
       (iVar1 = cargo_add_option(local_38,0,"--centauri -c",(char *)0x0,"b",&local_40), iVar1 == 0))
    {
      iVar1 = cargo_parse(local_38,0,1,3,(char **)&local_28);
      if (iVar1 == 0) {
        printf("a = Expect: %u Got: %u\n",1,(ulong)local_2c);
        if (local_2c == 1) {
          printf("b = Expect: %u Got: %u\n",1,(ulong)local_3c);
          if (local_3c == 1) {
            pcVar2 = (char *)0x0;
            printf("c = Expect: %u Got: %u\n",1,(ulong)local_40);
            if (local_40 != 1) {
              pcVar2 = "Expected c == 1";
            }
          }
          else {
            pcVar2 = "Expected b == 1";
          }
        }
        else {
          pcVar2 = "Expected a == 1";
        }
      }
      else {
        pcVar2 = "Parse failed";
      }
    }
    cargo_destroy(&local_38);
  }
  else {
    pcVar2 = "Failed to init cargo";
  }
  return pcVar2;
}

Assistant:

_TEST_START(TEST_bool_combined)
{
    unsigned int a = 0;
    unsigned int b = 0;
    unsigned int c = 0;
    char *args[] = { "program", "-abc", "123"};

    ret = cargo_add_option(cargo, 0, "--alpha -a", NULL, "b", &a);
    cargo_assert(ret == 0, "Failed to add option");

    ret = cargo_add_option(cargo, 0, "--beta -b", NULL, "b", &b);
    cargo_assert(ret == 0, "Failed to add option");

    ret = cargo_add_option(cargo, 0, "--centauri -c", NULL, "b", &c);
    cargo_assert(ret == 0, "Failed to add option");

    ret = cargo_parse(cargo, 0, 1, sizeof(args) / sizeof(args[0]), args);
    cargo_assert(ret == 0, "Parse failed");

    printf("a = Expect: %u Got: %u\n", 1, a);
    cargo_assert(a == 1, "Expected a == 1");

    printf("b = Expect: %u Got: %u\n", 1, b);
    cargo_assert(b == 1, "Expected b == 1");

    printf("c = Expect: %u Got: %u\n", 1, c);
    cargo_assert(c == 1, "Expected c == 1");

    _TEST_CLEANUP();
}